

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::hoopla_permute(size_t *B,size_t *end)

{
  ulong uVar1;
  unsigned_long *__ptr;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  __n = (long)end - (long)B;
  lVar11 = (long)__n >> 3;
  std::
  __sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(unsigned_long,unsigned_long)>>
            (B,end,(_Iter_comp_iter<bool_(*)(unsigned_long,_unsigned_long)>)0x2243dd);
  lVar13 = lVar11 + 1;
  __ptr = calloc_or_throw<unsigned_long>(lVar11 * 2 + 2);
  *(size_t *)((long)__ptr + __n) = *B;
  uVar2 = lVar11 - 1;
  __ptr[lVar11 + 1] = B[lVar11 + -1];
  uVar4 = 0;
  do {
    uVar3 = uVar4 + 1;
    if (uVar2 <= uVar3) {
      memcpy(B,__ptr + lVar11,__n);
      free(__ptr);
      return;
    }
    uVar1 = B[uVar2 - 1];
    uVar5 = __ptr[lVar13];
    uVar7 = B[uVar4 + 1];
    uVar9 = uVar5 - uVar1;
    if (uVar5 < uVar1) {
      uVar9 = -(uVar5 - uVar1);
    }
    uVar8 = uVar5 - uVar7;
    if (uVar5 < uVar7) {
      uVar8 = -(uVar5 - uVar7);
    }
    uVar5 = __ptr[lVar11];
    uVar6 = uVar5 - uVar1;
    if (uVar5 < uVar1) {
      uVar6 = -(uVar5 - uVar1);
    }
    uVar10 = uVar5 - uVar7;
    if (uVar5 < uVar7) {
      uVar10 = -(uVar5 - uVar7);
    }
    uVar5 = uVar6;
    if (uVar6 < uVar10) {
      uVar5 = uVar10;
    }
    if (uVar9 < uVar8) {
      uVar9 = uVar8;
    }
    if (uVar9 < uVar5) {
      uVar9 = uVar5;
    }
    if (uVar10 < uVar9) {
      if (uVar6 < uVar9) {
        if (uVar9 <= uVar8) {
          lVar12 = lVar13 + 1;
          lVar13 = lVar12;
          goto LAB_0021ee8e;
        }
        lVar12 = lVar13 + 1;
        lVar13 = lVar12;
      }
      else {
        lVar12 = lVar11 + -1;
        lVar11 = lVar12;
      }
      uVar2 = uVar2 - 1;
      uVar3 = uVar4;
      uVar7 = uVar1;
    }
    else {
      lVar12 = lVar11 + -1;
      lVar11 = lVar12;
    }
LAB_0021ee8e:
    __ptr[lVar12] = uVar7;
    uVar4 = uVar3;
  } while( true );
}

Assistant:

void hoopla_permute(size_t* B, size_t* end)
{
  // from Curtis IPL 2004, "Darts and hoopla board design"
  // first sort
  size_t N = end - B;
  std::sort(B, end, cmp_size_t);
  // make some temporary space
  size_t* A = calloc_or_throw<size_t>((N + 1) * 2);
  A[N] = B[0];                // arbitrarily choose the maximum in the middle
  A[N + 1] = B[N - 1];        // so the maximum goes next to it
  size_t lo = N, hi = N + 1;  // which parts of A have we filled in? [lo,hi]
  size_t i = 0, j = N - 1;    // which parts of B have we already covered? [0,i] and [j,N-1]
  while (i + 1 < j)
  {
    // there are four options depending on where things get placed
    size_t d1 = absdiff(A[lo], B[i + 1]);  // put B[i+1] at the bottom
    size_t d2 = absdiff(A[lo], B[j - 1]);  // put B[j-1] at the bottom
    size_t d3 = absdiff(A[hi], B[i + 1]);  // put B[i+1] at the top
    size_t d4 = absdiff(A[hi], B[j - 1]);  // put B[j-1] at the top
    size_t mx = max(max(d1, d2), max(d3, d4));
    if (d1 >= mx)
      A[--lo] = B[++i];
    else if (d2 >= mx)
      A[--lo] = B[--j];
    else if (d3 >= mx)
      A[++hi] = B[++i];
    else
      A[++hi] = B[--j];
  }
  // copy it back to B
  memcpy(B, A + lo, N * sizeof(size_t));
  // clean up
  free(A);
}